

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTWave_GetProperties(FACTWave *pWave,FACTWaveInstanceProperties *pProperties)

{
  long in_RSI;
  long in_RDI;
  uint16_t in_stack_00000016;
  FACTWaveBank *in_stack_00000018;
  undefined4 local_4;
  
  if (in_RDI != 0) {
    FAudio_PlatformLockMutex((FAudioMutex)0x116876);
    FACTWaveBank_GetWaveProperties(in_stack_00000018,in_stack_00000016,(FACTWaveProperties *)pWave);
    *(undefined4 *)(in_RSI + 0x54) = 0;
    FAudio_PlatformUnlockMutex((FAudioMutex)0x1168b5);
  }
  local_4 = (uint)(in_RDI == 0);
  return local_4;
}

Assistant:

uint32_t FACTWave_GetProperties(
	FACTWave *pWave,
	FACTWaveInstanceProperties *pProperties
) {
	if (pWave == NULL)
	{
		return 1;
	}
	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);

	FACTWaveBank_GetWaveProperties(
		pWave->parentBank,
		pWave->index,
		&pProperties->properties
	);

	/* FIXME: This is unsupported on PC, do we care about this? */
	pProperties->backgroundMusic = 0;

	FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
	return 0;
}